

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O0

char lejp_globals_cb(lejp_ctx *ctx,char reason)

{
  jpargs *a_00;
  char *pcVar1;
  int iVar2;
  uint uVar3;
  lws_protocol_vhost_options *plVar4;
  int n;
  lws_protocol_vhost_options *rej;
  jpargs *a;
  char reason_local;
  lejp_ctx *ctx_local;
  
  a_00 = (jpargs *)ctx->user;
  if (((reason & 0x40U) == 0) || (ctx->path_match == '\0')) {
    return '\0';
  }
  if ((reason == 'M') && (ctx->path_match == '\v')) {
    plVar4 = (lws_protocol_vhost_options *)lwsws_align(a_00);
    a_00->p = a_00->p + 0x20;
    iVar2 = lejp_get_wildcard(ctx,0,a_00->p,(int)a_00->end - (int)a_00->p);
    plVar4->next = a_00->info->reject_service_keywords;
    a_00->info->reject_service_keywords = plVar4;
    plVar4->name = a_00->p;
    _lws_log(4,"  adding rej %s=%s\n",a_00->p,ctx->buf);
    a_00->p = a_00->p + (iVar2 + -1);
    pcVar1 = a_00->p;
    a_00->p = pcVar1 + 1;
    *pcVar1 = '\0';
    plVar4->value = a_00->p;
    plVar4->options = (lws_protocol_vhost_options *)0x0;
    goto LAB_0015adab;
  }
  switch(ctx->path_match) {
  case '\x01':
    iVar2 = atoi(ctx->buf);
    a_00->info->uid = iVar2;
    break;
  case '\x02':
    iVar2 = atoi(ctx->buf);
    a_00->info->gid = iVar2;
    break;
  case '\x03':
    a_00->info->username = a_00->p;
    goto LAB_0015adab;
  case '\x04':
    a_00->info->groupname = a_00->p;
    goto LAB_0015adab;
  case '\x05':
    uVar3 = atoi(ctx->buf);
    a_00->info->count_threads = uVar3;
    break;
  case '\x06':
    iVar2 = arg_to_bool(ctx->buf);
    if (iVar2 != 0) {
      a_00->info->options = a_00->info->options | 0x1000;
    }
    break;
  case '\a':
    a_00->info->server_string = a_00->p;
    goto LAB_0015adab;
  case '\b':
    if (a_00->count_plugin_dirs == 9) {
      _lws_log(1,"Too many plugin dirs\n");
      return -1;
    }
    iVar2 = a_00->count_plugin_dirs;
    a_00->count_plugin_dirs = iVar2 + 1;
    a_00->plugin_dirs[iVar2] = a_00->p;
    goto LAB_0015adab;
  case '\t':
    iVar2 = atoi(ctx->buf);
    a_00->info->ws_ping_pong_interval = (unsigned_short)iVar2;
    break;
  case '\n':
    uVar3 = atoi(ctx->buf);
    a_00->info->timeout_secs = uVar3;
    break;
  default:
    break;
  case '\r':
    a_00->info->alpn = a_00->p;
LAB_0015adab:
    iVar2 = lws_snprintf(a_00->p,(long)a_00->end - (long)a_00->p,"%s",ctx->buf);
    a_00->p = a_00->p + iVar2;
    pcVar1 = a_00->p;
    a_00->p = pcVar1 + 1;
    *pcVar1 = '\0';
    break;
  case '\x0e':
    iVar2 = atoi(ctx->buf);
    a_00->info->ip_limit_ah = (unsigned_short)iVar2;
    break;
  case '\x0f':
    iVar2 = atoi(ctx->buf);
    a_00->info->ip_limit_wsi = (unsigned_short)iVar2;
  }
  return '\0';
}

Assistant:

static signed char
lejp_globals_cb(struct lejp_ctx *ctx, char reason)
{
	struct jpargs *a = (struct jpargs *)ctx->user;
	struct lws_protocol_vhost_options *rej;
	int n;

	/* we only match on the prepared path strings */
	if (!(reason & LEJP_FLAG_CB_IS_VALUE) || !ctx->path_match)
		return 0;

	/* this catches, eg, vhosts[].headers[].xxx */
	if (reason == LEJPCB_VAL_STR_END &&
	    ctx->path_match == LWJPGP_REJECT_SERVICE_KEYWORDS_NAME + 1) {
		rej = lwsws_align(a);
		a->p += sizeof(*rej);

		n = lejp_get_wildcard(ctx, 0, a->p, lws_ptr_diff(a->end, a->p));
		rej->next = a->info->reject_service_keywords;
		a->info->reject_service_keywords = rej;
		rej->name = a->p;
		 lwsl_notice("  adding rej %s=%s\n", a->p, ctx->buf);
		a->p += n - 1;
		*(a->p++) = '\0';
		rej->value = a->p;
		rej->options = NULL;
		goto dostring;
	}

	switch (ctx->path_match - 1) {
	case LEJPGP_UID:
		a->info->uid = atoi(ctx->buf);
		return 0;
	case LEJPGP_GID:
		a->info->gid = atoi(ctx->buf);
		return 0;
	case LEJPGP_USERNAME:
		a->info->username = a->p;
		break;
	case LEJPGP_GROUPNAME:
		a->info->groupname = a->p;
		break;
	case LEJPGP_COUNT_THREADS:
		a->info->count_threads = atoi(ctx->buf);
		return 0;
	case LWJPGP_INIT_SSL:
		if (arg_to_bool(ctx->buf))
			a->info->options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
		return 0;
	case LEJPGP_SERVER_STRING:
#if defined(LWS_WITH_SERVER)
		a->info->server_string = a->p;
#endif
		break;
	case LEJPGP_PLUGIN_DIR:
		if (a->count_plugin_dirs == MAX_PLUGIN_DIRS - 1) {
			lwsl_err("Too many plugin dirs\n");
			return -1;
		}
		a->plugin_dirs[a->count_plugin_dirs++] = a->p;
		break;

	case LWJPGP_PINGPONG_SECS:
		a->info->ws_ping_pong_interval = atoi(ctx->buf);
		return 0;

	case LWJPGP_TIMEOUT_SECS:
		a->info->timeout_secs = atoi(ctx->buf);
		return 0;

	case LWJPGP_DEFAULT_ALPN:
		a->info->alpn = a->p;
		break;

	case LWJPGP_IP_LIMIT_AH:
		a->info->ip_limit_ah = atoi(ctx->buf);
		return 0;

	case LWJPGP_IP_LIMIT_WSI:
		a->info->ip_limit_wsi = atoi(ctx->buf);
		return 0;

	default:
		return 0;
	}

dostring:
	a->p += lws_snprintf(a->p, a->end - a->p, "%s", ctx->buf);
	*(a->p)++ = '\0';

	return 0;
}